

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int message_create_IoTHubMessage_from_uamqp_message
              (MESSAGE_HANDLE uamqp_message,IOTHUB_MESSAGE_HANDLE *iothubclient_message)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  BINARY_DATA binary_data;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_HANDLE pIStack_28;
  MESSAGE_BODY_TYPE body_type;
  IOTHUB_MESSAGE_HANDLE iothub_message;
  IOTHUB_MESSAGE_HANDLE *ppIStack_18;
  int result;
  IOTHUB_MESSAGE_HANDLE *iothubclient_message_local;
  MESSAGE_HANDLE uamqp_message_local;
  
  iothub_message._4_4_ = 0x471;
  pIStack_28 = (IOTHUB_MESSAGE_HANDLE)0x0;
  ppIStack_18 = iothubclient_message;
  iothubclient_message_local = (IOTHUB_MESSAGE_HANDLE *)uamqp_message;
  iVar1 = message_get_body_type(uamqp_message,(MESSAGE_BODY_TYPE *)((long)&l + 4));
  if (iVar1 == 0) {
    if (l._4_4_ == 2) {
      iVar1 = message_get_body_amqp_data_in_place
                        ((MESSAGE_HANDLE)iothubclient_message_local,0,(BINARY_DATA *)&l_1);
      if (iVar1 == 0) {
        pIStack_28 = IoTHubMessage_CreateFromByteArray((uchar *)l_1,(size_t)binary_data.bytes);
        if (pIStack_28 == (IOTHUB_MESSAGE_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"message_create_IoTHubMessage_from_uamqp_message",0x487,1,
                      "Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed)."
                     );
          }
          iothub_message._4_4_ = 0x488;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"message_create_IoTHubMessage_from_uamqp_message",0x482,1,
                    "Failed to get the body of the uamqp message.");
        }
        iothub_message._4_4_ = 0x483;
      }
    }
  }
  else {
    binary_data.length = (size_t)xlogging_get_log_function();
    if ((LOGGER_LOG)binary_data.length != (LOGGER_LOG)0x0) {
      (*(code *)binary_data.length)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                 ,"message_create_IoTHubMessage_from_uamqp_message",0x478,1,
                 "Failed to get the type of the uamqp message.");
    }
    iothub_message._4_4_ = 0x479;
  }
  if (pIStack_28 != (IOTHUB_MESSAGE_HANDLE)0x0) {
    iVar1 = readPropertiesFromuAMQPMessage(pIStack_28,(MESSAGE_HANDLE)iothubclient_message_local);
    if (iVar1 == 0) {
      iVar1 = readApplicationPropertiesFromuAMQPMessage
                        (pIStack_28,(MESSAGE_HANDLE)iothubclient_message_local);
      if (iVar1 == 0) {
        *ppIStack_18 = pIStack_28;
        iothub_message._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"message_create_IoTHubMessage_from_uamqp_message",0x497,1,
                    "Failed reading application properties of the uamqp message.");
        }
        IoTHubMessage_Destroy(pIStack_28);
        iothub_message._4_4_ = 0x499;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"message_create_IoTHubMessage_from_uamqp_message",0x491,1,
                  "Failed reading properties of the uamqp message.");
      }
      IoTHubMessage_Destroy(pIStack_28);
      iothub_message._4_4_ = 0x493;
    }
  }
  return iothub_message._4_4_;
}

Assistant:

int message_create_IoTHubMessage_from_uamqp_message(MESSAGE_HANDLE uamqp_message, IOTHUB_MESSAGE_HANDLE* iothubclient_message)
{
    int result = MU_FAILURE;

    IOTHUB_MESSAGE_HANDLE iothub_message = NULL;
    MESSAGE_BODY_TYPE body_type;

    if (message_get_body_type(uamqp_message, &body_type) != 0)
    {
        LogError("Failed to get the type of the uamqp message.");
        result = MU_FAILURE;
    }
    else
    {
        if (body_type == MESSAGE_BODY_TYPE_DATA)
        {
            BINARY_DATA binary_data;
            if (message_get_body_amqp_data_in_place(uamqp_message, 0, &binary_data) != 0)
            {
                LogError("Failed to get the body of the uamqp message.");
                result = MU_FAILURE;
            }
            else if ((iothub_message = IoTHubMessage_CreateFromByteArray(binary_data.bytes, binary_data.length)) == NULL)
            {
                LogError("Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed).");
                result = MU_FAILURE;
            }
        }
    }

    if (iothub_message != NULL)
    {
        if (readPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else if (readApplicationPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading application properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else
        {
            *iothubclient_message = iothub_message;
            result = RESULT_OK;
        }
    }

    return result;
}